

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O3

void __thiscall Wall::do_ball(Wall *this,actor_ref *param_1,msg_ball *param_2)

{
  int iVar1;
  __uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_10;
  
  if (this->m_finished == false) {
    this->m_counter = this->m_counter + 1;
    iVar1 = rand();
    if (this->m_players[iVar1 % 10000].object_ != (object_t *)0x0) {
      local_10._M_t.
      super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
      super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl =
           (tuple<acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>)operator_new(0x20);
      *(long *)((long)local_10._M_t.
                      super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>
                      .super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl + 8) = 0;
      *(pointer_____offset_0x10___ **)
       ((long)local_10._M_t.
              super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
              super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl + 0x10) =
           &msg_ball::typeinfo;
      *(long *)((long)local_10._M_t.
                      super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>
                      .super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl + 0x18) = 0;
      *(undefined ***)
       local_10._M_t.
       super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
       super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl = &PTR__msg_t_0010e900;
      acto::actor_ref::send_message
                (this->m_players + iVar1 % 10000,
                 (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)&local_10
                );
      if ((_Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>)
          local_10._M_t.
          super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
          super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl != (msg_t *)0x0) {
        (**(code **)(*(long *)local_10._M_t.
                              super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>
                              .super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl + 8))
                  ();
      }
    }
  }
  return;
}

Assistant:

void do_ball(acto::actor_ref, const msg_ball&) {
    if (!m_finished) {
      // Увеличить счетчик отскоков от стены
      m_counter++;
      // Послать случайно выбранному игроку
      m_players[ (rand() % PLAYERS) ].send(msg_ball());
    }
  }